

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O2

void qDrawPlainRect(QPainter *p,int x,int y,int w,int h,QColor *c,int lineWidth,QBrush *fill)

{
  long in_FS_OFFSET;
  double dVar1;
  QBrush local_70 [8];
  QRectF local_68;
  QPainterStateGuard local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (h != 0 && w != 0) {
    if ((h | w | lineWidth) < 0) {
      local_68.xp._0_4_ = 2;
      local_68.w._4_4_ = 0;
      local_68.xp._4_4_ = 0;
      local_68.yp._0_4_ = 0;
      local_68.yp._4_4_ = 0;
      local_68.w._0_4_ = 0;
      local_68.h = 3.05543930413181e-317;
      QMessageLogger::warning((char *)&local_68,"qDrawPlainRect: Invalid parameters");
    }
    else {
      local_48.m_level = 0;
      local_48._12_4_ = 0xaaaaaaaa;
      local_48.m_painter = p;
      QPainterStateGuard::save(&local_48);
      if (lineWidth != 0 || fill != (QBrush *)0x0) {
        if (0 < lineWidth) {
          QBrush::QBrush(local_70,(QColor *)c,SolidPattern);
          QPen::QPen((QPen *)&local_68,local_70,(double)lineWidth,SolidLine,SquareCap,MiterJoin);
          QPainter::setPen((QPen *)p);
          QPen::~QPen((QPen *)&local_68);
          QBrush::~QBrush(local_70);
        }
        if (fill == (QBrush *)0x0) {
          QBrush::QBrush((QBrush *)&local_68,NoBrush);
        }
        else {
          QBrush::QBrush((QBrush *)&local_68,fill);
        }
        QPainter::setBrush((QBrush *)p);
        QBrush::~QBrush((QBrush *)&local_68);
        dVar1 = (double)lineWidth * 0.5;
        local_68.xp = (double)x + dVar1;
        local_68.yp = (double)y + dVar1;
        local_68.w = ((double)w - dVar1) - dVar1;
        local_68.h = ((double)h - dVar1) - dVar1;
        QPainter::drawRect(p,&local_68);
      }
      QPainterStateGuard::~QPainterStateGuard(&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qDrawPlainRect(QPainter *p, int x, int y, int w, int h, const QColor &c,
                    int lineWidth, const QBrush *fill)
{
    if (w == 0 || h == 0)
        return;
    if (Q_UNLIKELY(w < 0 || h < 0 || lineWidth < 0)) {
        qWarning("qDrawPlainRect: Invalid parameters");
        return;
    }

    QPainterStateGuard painterGuard(p);
    if (lineWidth == 0 && !fill)
        return;
    if (lineWidth > 0)
        p->setPen(QPen(c, lineWidth, Qt::SolidLine, Qt::SquareCap, Qt::MiterJoin));
    p->setBrush(fill ? *fill : Qt::NoBrush);
    const QRectF r(x, y, w, h);
    const auto lw2 = lineWidth / 2.;
    const QRectF rect = r.marginsRemoved(QMarginsF(lw2, lw2, lw2, lw2));
    p->drawRect(rect);
}